

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O0

void FT_GlyphLoader_Prepare(FT_GlyphLoader loader)

{
  FT_GlyphLoad current;
  FT_GlyphLoader loader_local;
  
  (loader->current).outline.n_points = 0;
  (loader->current).outline.n_contours = 0;
  (loader->current).num_subglyphs = 0;
  FT_GlyphLoader_Adjust_Points(loader);
  FT_GlyphLoader_Adjust_Subglyphs(loader);
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_GlyphLoader_Prepare( FT_GlyphLoader  loader )
  {
    FT_GlyphLoad  current = &loader->current;


    current->outline.n_points   = 0;
    current->outline.n_contours = 0;
    current->num_subglyphs      = 0;

    FT_GlyphLoader_Adjust_Points   ( loader );
    FT_GlyphLoader_Adjust_Subglyphs( loader );
  }